

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestNetwork::~TestNetwork(TestNetwork *this)

{
  TestNetwork *this_local;
  
  kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>_>::
  ~HashMap(&this->map);
  RpcDumper::~RpcDumper(&this->dumper);
  return;
}

Assistant:

TestNetwork::~TestNetwork() noexcept(false) {}